

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
          (CodeGenGenericContext *this,uchar *instRegKillInfo)

{
  byte bVar1;
  uint local_24;
  uint k;
  uint preKillCount;
  uint regKillCounts;
  uchar *instRegKillInfo_local;
  CodeGenGenericContext *this_local;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 != 0) {
    _preKillCount = instRegKillInfo + 1;
    for (local_24 = 0; local_24 < bVar1 >> 4; local_24 = local_24 + 1) {
      KillUnreadRegVmRegister(this,*_preKillCount);
      _preKillCount = _preKillCount + 1;
    }
  }
  return;
}

Assistant:

void CodeGenGenericContext::KillEarlyUnreadRegVmRegisters(unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);

		for(unsigned k = 0; k < preKillCount; k++)
			KillUnreadRegVmRegister(*instRegKillInfo++);
	}
}